

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsGetPropertyIdFromNameInternal(WCHAR *name,size_t cPropertyNameLength,JsPropertyIdRef *propertyId)

{
  JsErrorCode JVar1;
  WCHAR **local_38;
  size_t *local_30;
  WCHAR **local_28;
  WCHAR *local_20;
  WCHAR *name_local;
  size_t cPropertyNameLength_local;
  JsPropertyIdRef *propertyId_local;
  
  local_38 = &local_20;
  local_28 = &name_local;
  local_30 = &cPropertyNameLength_local;
  local_20 = name;
  name_local = (WCHAR *)cPropertyNameLength;
  cPropertyNameLength_local = (size_t)propertyId;
  JVar1 = ContextAPINoScriptWrapper_Core<ContextAPINoScriptWrapper_NoRecord<JsGetPropertyIdFromNameInternal(char16_t_const*,unsigned_long,void**)::_lambda(Js::ScriptContext*)_1_>(JsGetPropertyIdFromNameInternal(char16_t_const*,unsigned_long,void**)::_lambda(Js::ScriptContext*)_1_,bool,bool)::_lambda(Js::ScriptContext*)_1_>
                    ((anon_class_24_3_e1295a6b *)&local_38,false,false);
  return JVar1;
}

Assistant:

inline JsErrorCode JsGetPropertyIdFromNameInternal(_In_z_ const WCHAR *name, size_t cPropertyNameLength, _Out_ JsPropertyIdRef *propertyId)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext * scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(name);
        PARAM_NOT_NULL(propertyId);
        *propertyId = nullptr;

        if (cPropertyNameLength <= INT_MAX)
        {
            scriptContext->GetOrAddPropertyRecord(name, static_cast<int>(cPropertyNameLength), (Js::PropertyRecord const **)propertyId);

            return JsNoError;
        }
        else
        {
            return JsErrorOutOfMemory;
        }
    });
}